

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteNextChar(WatWriter *this)

{
  NextChar NVar1;
  WatWriter *this_local;
  
  NVar1 = this->next_char_;
  if (NVar1 != None) {
    if (NVar1 == Space) {
      Stream::WriteChar(this->stream_,' ',(char *)0x0,No);
    }
    else if (NVar1 - Newline < 2) {
      Stream::WriteChar(this->stream_,'\n',(char *)0x0,No);
      WriteIndent(this);
    }
  }
  this->next_char_ = None;
  return;
}

Assistant:

void WatWriter::WriteNextChar() {
  switch (next_char_) {
    case NextChar::Space:
      stream_->WriteChar(' ');
      break;
    case NextChar::Newline:
    case NextChar::ForceNewline:
      stream_->WriteChar('\n');
      WriteIndent();
      break;
    case NextChar::None:
      break;
  }
  next_char_ = NextChar::None;
}